

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

String * __thiscall
capnp::anon_unknown_79::Parser::consumeQuotedString(String *__return_storage_ptr__,Parser *this)

{
  Input *this_00;
  char *pcVar1;
  RemoveConst<char> *pRVar2;
  Fault FVar3;
  char cVar4;
  byte bVar5;
  byte *pbVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  byte *pbVar11;
  size_t sVar12;
  char *pcVar13;
  ArrayPtr<const_char16_t> utf16;
  Vector<char> decoded;
  Fault f;
  Fault f_1;
  Vector<char> local_88;
  Fault local_60;
  EncodingResult<kj::String> local_58;
  String *local_38;
  
  this_00 = &this->input;
  local_38 = __return_storage_ptr__;
  Input::consume(this_00,'\"');
  local_88.builder.ptr = (char *)0x0;
  local_88.builder.pos = (RemoveConst<char> *)0x0;
  local_88.builder.endPtr = (char *)0x0;
  do {
    pcVar13 = (this->input).wrapped.ptr;
    while (((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
            (cVar4 = Input::nextChar(this_00), cVar4 != '\"')) && (cVar4 != '\\'))) {
      Input::advance(this_00,1);
    }
    pcVar1 = (this_00->wrapped).ptr;
    sVar10 = (long)pcVar1 - (long)pcVar13;
    pbVar6 = (byte *)(local_88.builder.pos + (sVar10 - (long)local_88.builder.ptr));
    if (local_88.builder.endPtr + -(long)local_88.builder.ptr < pbVar6) {
      pbVar11 = (byte *)((long)(local_88.builder.endPtr + -(long)local_88.builder.ptr) * 2);
      if (local_88.builder.endPtr == local_88.builder.ptr) {
        pbVar11 = (byte *)0x4;
      }
      if (pbVar11 < pbVar6) {
        pbVar11 = pbVar6;
      }
      kj::Vector<char>::setCapacity(&local_88,(size_t)pbVar11);
    }
    pRVar2 = local_88.builder.pos;
    if (pcVar1 != pcVar13) {
      memcpy(local_88.builder.pos,pcVar13,sVar10);
      local_88.builder.pos = pRVar2 + sVar10;
    }
    cVar4 = Input::nextChar(this_00);
    if (cVar4 == '\\') {
      Input::advance(this_00,1);
      bVar5 = Input::nextChar(this_00);
      if (bVar5 < 0x62) {
        if (bVar5 == 0x22) {
          bVar5 = 0x22;
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.endPtr == local_88.builder.ptr) {
              sVar12 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar12);
          }
        }
        else if (bVar5 == 0x2f) {
          bVar5 = 0x2f;
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.endPtr == local_88.builder.ptr) {
              sVar12 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar12);
          }
        }
        else {
          if (bVar5 != 0x5c) goto switchD_001f0c24_caseD_6f;
          bVar5 = 0x5c;
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.endPtr == local_88.builder.ptr) {
              sVar12 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar12);
          }
        }
      }
      else {
        switch(bVar5) {
        case 0x6e:
          bVar5 = 10;
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.endPtr == local_88.builder.ptr) {
              sVar12 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar12);
          }
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
switchD_001f0c24_caseD_6f:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                    ((Fault *)&local_58,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x302,FAILED,(char *)0x0,"\"Invalid escape in JSON string.\"",
                     (char (*) [31])"Invalid escape in JSON string.");
          kj::_::Debug::Fault::fatal((Fault *)&local_58);
        case 0x72:
          bVar5 = 0xd;
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.endPtr == local_88.builder.ptr) {
              sVar12 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar12);
          }
          break;
        case 0x74:
          bVar5 = 9;
          if (local_88.builder.pos == local_88.builder.endPtr) {
            sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
            if (local_88.builder.endPtr == local_88.builder.ptr) {
              sVar12 = 4;
            }
            kj::Vector<char>::setCapacity(&local_88,sVar12);
          }
          break;
        case 0x75:
          Input::consume(this_00,'u');
          pcVar13 = (this_00->wrapped).ptr;
          Input::advance(this_00,4);
          if ((long)(this_00->wrapped).ptr - (long)pcVar13 != 4) {
            local_60.exception = (Exception *)0x0;
            local_58.super_String.content.ptr = (char *)0x0;
            local_58.super_String.content.size_ = 0;
            kj::_::Debug::Fault::init
                      (&local_60,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                      );
            kj::_::Debug::Fault::fatal(&local_60);
          }
          lVar7 = 0;
          uVar9 = 0;
          do {
            FVar3.exception = local_60.exception;
            cVar4 = pcVar13[lVar7];
            utf16.size_._0_4_ = (int)cVar4;
            local_60.exception._0_1_ = cVar4;
            iVar8 = -0x30;
            if (((9 < (byte)(cVar4 - 0x30U)) && (iVar8 = -0x61, 5 < (byte)(cVar4 + 0x9fU))) &&
               (iVar8 = -0x41, 5 < (byte)(cVar4 + 0xbfU))) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],char&>
                        ((Fault *)&local_58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                         ,0x33a,FAILED,(char *)0x0,"\"Invalid hex digit in unicode escape.\", c",
                         (char (*) [37])"Invalid hex digit in unicode escape.",(char *)&local_60);
              kj::_::Debug::Fault::fatal((Fault *)&local_58);
            }
            uVar9 = iVar8 + (int)utf16.size_ | uVar9 << 4;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          if ((int)uVar9 < 0x80) {
            if (local_88.builder.pos == local_88.builder.endPtr) {
              sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
              if (local_88.builder.endPtr == local_88.builder.ptr) {
                sVar12 = 4;
              }
              kj::Vector<char>::setCapacity(&local_88,sVar12);
            }
            *local_88.builder.pos = (byte)uVar9 & 0x7f;
            local_88.builder.pos = local_88.builder.pos + 1;
          }
          else {
            local_60.exception._2_6_ = SUB86(FVar3.exception,2);
            local_60.exception._0_2_ = (short)uVar9;
            utf16.ptr = (char16_t *)0x1;
            utf16.size_._4_4_ = 0;
            kj::decodeUtf16(&local_58,(kj *)&local_60,utf16);
            pcVar13 = local_58.super_String.content.ptr + (local_58.super_String.content.size_ - 1);
            pcVar1 = local_58.super_String.content.ptr;
            if (local_58.super_String.content.size_ == 0) {
              pcVar13 = (char *)0x0;
              pcVar1 = (char *)0x0;
            }
            sVar10 = (long)pcVar13 - (long)pcVar1;
            pbVar6 = (byte *)(local_88.builder.pos + (sVar10 - (long)local_88.builder.ptr));
            if (local_88.builder.endPtr + -(long)local_88.builder.ptr < pbVar6) {
              pbVar11 = (byte *)((long)(local_88.builder.endPtr + -(long)local_88.builder.ptr) * 2);
              if (local_88.builder.endPtr == local_88.builder.ptr) {
                pbVar11 = (byte *)0x4;
              }
              if (pbVar11 < pbVar6) {
                pbVar11 = pbVar6;
              }
              kj::Vector<char>::setCapacity(&local_88,(size_t)pbVar11);
            }
            pRVar2 = local_88.builder.pos;
            if (pcVar1 != pcVar13) {
              memcpy(local_88.builder.pos,pcVar1,sVar10);
              local_88.builder.pos = pRVar2 + sVar10;
            }
            sVar12 = local_58.super_String.content.size_;
            pcVar13 = local_58.super_String.content.ptr;
            if (local_58.super_String.content.ptr != (char *)0x0) {
              local_58.super_String.content.ptr = (char *)0x0;
              local_58.super_String.content.size_ = 0;
              (**(local_58.super_String.content.disposer)->_vptr_ArrayDisposer)
                        (local_58.super_String.content.disposer,pcVar13,1,sVar12,sVar12,0);
            }
          }
          goto LAB_001f0ea8;
        default:
          if (bVar5 == 0x62) {
            bVar5 = 8;
            if (local_88.builder.pos == local_88.builder.endPtr) {
              sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
              if (local_88.builder.endPtr == local_88.builder.ptr) {
                sVar12 = 4;
              }
              kj::Vector<char>::setCapacity(&local_88,sVar12);
            }
          }
          else {
            if (bVar5 != 0x66) goto switchD_001f0c24_caseD_6f;
            bVar5 = 0xc;
            if (local_88.builder.pos == local_88.builder.endPtr) {
              sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
              if (local_88.builder.endPtr == local_88.builder.ptr) {
                sVar12 = 4;
              }
              kj::Vector<char>::setCapacity(&local_88,sVar12);
            }
          }
        }
      }
      *local_88.builder.pos = bVar5;
      local_88.builder.pos = local_88.builder.pos + 1;
      Input::advance(this_00,1);
    }
LAB_001f0ea8:
    cVar4 = Input::nextChar(this_00);
    if (cVar4 == '\"') {
      Input::consume(this_00,'\"');
      if (local_88.builder.pos == local_88.builder.endPtr) {
        sVar12 = 4;
        if (local_88.builder.endPtr != local_88.builder.ptr) {
          sVar12 = ((long)local_88.builder.endPtr - (long)local_88.builder.ptr) * 2;
        }
        kj::Vector<char>::setCapacity(&local_88,sVar12);
      }
      *local_88.builder.pos = 0;
      local_88.builder.pos = local_88.builder.pos + 1;
      if (local_88.builder.pos != local_88.builder.endPtr) {
        kj::Vector<char>::setCapacity
                  (&local_88,(long)local_88.builder.pos - (long)local_88.builder.ptr);
      }
      (local_38->content).ptr = local_88.builder.ptr;
      (local_38->content).size_ = (long)local_88.builder.pos - (long)local_88.builder.ptr;
      (local_38->content).disposer = local_88.builder.disposer;
      return local_38;
    }
  } while( true );
}

Assistant:

kj::String consumeQuotedString() {
    input.consume('"');
    // TODO(perf): Avoid copy / alloc if no escapes encoutered.
    // TODO(perf): Get statistics on string size and preallocate?
    kj::Vector<char> decoded;

    do {
      auto stringValue = input.consumeWhile([](const char chr) {
          return chr != '"' && chr != '\\';
      });

      decoded.addAll(stringValue);

      if (input.nextChar() == '\\') {  // handle escapes.
        input.advance();
        switch(input.nextChar()) {
          case '"' : decoded.add('"' ); input.advance(); break;
          case '\\': decoded.add('\\'); input.advance(); break;
          case '/' : decoded.add('/' ); input.advance(); break;
          case 'b' : decoded.add('\b'); input.advance(); break;
          case 'f' : decoded.add('\f'); input.advance(); break;
          case 'n' : decoded.add('\n'); input.advance(); break;
          case 'r' : decoded.add('\r'); input.advance(); break;
          case 't' : decoded.add('\t'); input.advance(); break;
          case 'u' :
            input.consume('u');
            unescapeAndAppend(input.consume(size_t(4)), decoded);
            break;
          default: KJ_FAIL_REQUIRE("Invalid escape in JSON string."); break;
        }
      }

    } while(input.nextChar() != '"');

    input.consume('"');
    decoded.add('\0');

    // TODO(perf): This copy can be eliminated, but I can't find the kj::wayToDoIt();
    return kj::String(decoded.releaseAsArray());
  }